

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O2

Proxy * __thiscall Proxy::operator=(Proxy *this,Proxy *param_1)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CService::operator=(&this->proxy,&param_1->proxy);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_unix_socket_path,&param_1->m_unix_socket_path);
  bVar2 = param_1->m_randomize_credentials;
  this->m_is_unix_socket = param_1->m_is_unix_socket;
  this->m_randomize_credentials = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

Proxy() : m_is_unix_socket(false), m_randomize_credentials(false) {}